

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O0

pboolean p_cond_variable_broadcast(PCondVariable *cond)

{
  int iVar1;
  PCondVariable *cond_local;
  
  if (cond == (PCondVariable *)0x0) {
    cond_local._4_4_ = 0;
  }
  else {
    iVar1 = pthread_cond_broadcast((pthread_cond_t *)cond);
    if (iVar1 == 0) {
      cond_local._4_4_ = 1;
    }
    else {
      printf("** Error: %s **\n",
             "PCondVariable::p_cond_variable_broadcast: thread_cond_broadcast() failed");
      cond_local._4_4_ = 0;
    }
  }
  return cond_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_cond_variable_broadcast (PCondVariable *cond)
{
	if (P_UNLIKELY (cond == NULL))
		return FALSE;

	if (P_UNLIKELY (pthread_cond_broadcast (&cond->hdl) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_broadcast: thread_cond_broadcast() failed");
		return FALSE;
	}

	return TRUE;
}